

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

void cfd::api::json::PsbtBip32Data::CollectFieldName(void)

{
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data> func_table;
  _Any_data local_f8;
  undefined1 local_e8 [16];
  code *local_d8 [2];
  code *local_c8;
  code *pcStack_c0;
  code *local_b8 [2];
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  if (json_mapper_abi_cxx11_._40_8_ == 0) {
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_68 = (code *)0x0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetPubkeyString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtBip32Data_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtBip32Data_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetPubkeyString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetPubkeyFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>>
    ::
    _M_emplace_unique<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>>
                *)json_mapper_abi_cxx11_,(char (*) [7])0x5eb233,
               (CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"pubkey","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetMaster_fingerprintString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtBip32Data_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtBip32Data_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetMaster_fingerprintString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetMaster_fingerprintFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>>
    ::
    _M_emplace_unique<char_const(&)[19],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>>
                *)json_mapper_abi_cxx11_,(char (*) [19])"master_fingerprint",
               (CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"master_fingerprint","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetPathString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtBip32Data_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtBip32Data_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetPathString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetPathFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>>
    ::
    _M_emplace_unique<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>>
                *)json_mapper_abi_cxx11_,(char (*) [5])"path",
               (CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"path","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetDescriptorString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtBip32Data_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::PsbtBip32Data_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetDescriptorString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&),_void_(*)(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetDescriptorFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtBip32Data_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::PsbtBip32Data_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>>
    ::
    _M_emplace_unique<char_const(&)[11],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data>>>>
                *)json_mapper_abi_cxx11_,(char (*) [11])0x59a378,
               (CLASS_FUNCTION_TABLE<cfd::api::json::PsbtBip32Data> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"descriptor","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
  }
  return;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}